

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::RepeatedFieldHelper<1>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  int iVar1;
  RepeatedField<double> *this;
  void *in_RDI;
  int i;
  RepeatedField<double> *array;
  int iVar2;
  int index;
  
  this = Get<google::protobuf::RepeatedField<double>>(in_RDI);
  iVar2 = 0;
  while( true ) {
    index = iVar2;
    iVar1 = RepeatedField<double>::size(this);
    if (iVar1 <= iVar2) break;
    WriteTagTo<google::protobuf::io::CodedOutputStream>
              ((uint32)((ulong)this >> 0x20),(CodedOutputStream *)CONCAT44(index,iVar2));
    RepeatedField<double>::operator[](this,index);
    SerializeTo<1,google::protobuf::io::CodedOutputStream>
              (this,(CodedOutputStream *)CONCAT44(index,iVar2));
    iVar2 = index + 1;
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }